

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O0

Result<wallet::SelectionResult> *
wallet::coinselector_tests::select_coins
          (CAmount *target,CoinSelectionParams *cs_params,CCoinControl *cc,
          function<wallet::CoinsResult_(wallet::CWallet_&)> *coin_setup,NodeContext *m_node)

{
  bool bVar1;
  size_type sVar2;
  long lVar3;
  char *in_RDX;
  lazy_ostream *in_RSI;
  Result<wallet::SelectionResult> *in_RDI;
  long in_FS_OFFSET;
  size_type signedTxSize;
  Result<wallet::SelectionResult> *result;
  CoinSelectionParams *in_stack_00000120;
  unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> wallet;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock21;
  CoinsResult available_coins;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd98;
  lazy_ostream *in_stack_fffffffffffffda0;
  char *in_stack_fffffffffffffda8;
  function<wallet::CoinsResult_(wallet::CWallet_&)> *in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb8;
  int in_stack_fffffffffffffdbc;
  const_string *in_stack_fffffffffffffdc0;
  T *in_stack_fffffffffffffdc8;
  const_string *in_stack_fffffffffffffdd0;
  const_string *file;
  allocator<char> *in_stack_fffffffffffffdd8;
  const_string *this;
  char *in_stack_fffffffffffffde0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde8;
  string *in_stack_fffffffffffffe00;
  NodeContext *in_stack_fffffffffffffe08;
  CCoinControl *coin_control;
  CAmount *in_stack_fffffffffffffe38;
  PreSelectedInputs *in_stack_fffffffffffffe40;
  uint in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  CWallet *in_stack_fffffffffffffe50;
  const_string *local_178;
  undefined1 local_170 [16];
  undefined1 local_160 [64];
  long local_120;
  undefined1 local_118 [16];
  undefined1 local_108 [71];
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  coin_control = (CCoinControl *)&stack0xffffffffffffff3f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  NewWallet(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  std::__cxx11::string::~string(in_stack_fffffffffffffd98);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff3f);
  std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*
            ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
             in_stack_fffffffffffffda8);
  std::function<wallet::CoinsResult_(wallet::CWallet_&)>::operator()
            (in_stack_fffffffffffffdb0,(CWallet *)in_stack_fffffffffffffda8);
  std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator->
            ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
             in_stack_fffffffffffffd98);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffd98);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffdd8,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffdd0,
             (char *)in_stack_fffffffffffffdc8,(char *)in_stack_fffffffffffffdc0,
             in_stack_fffffffffffffdbc,SUB41((uint)in_stack_fffffffffffffdb8 >> 0x18,0));
  in_stack_fffffffffffffe48 = in_stack_fffffffffffffe48 & 0xffffff;
  std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*
            ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
             in_stack_fffffffffffffda8);
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  std::
  set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::set((set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
         *)in_stack_fffffffffffffd98);
  local_78 = 0;
  SelectCoins(in_stack_fffffffffffffe50,
              (CoinsResult *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
              in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,coin_control,in_stack_00000120);
  PreSelectedInputs::~PreSelectedInputs((PreSelectedInputs *)in_RDX);
  bVar1 = util::Result::operator_cast_to_bool((Result<wallet::SelectionResult> *)in_RDX);
  if (bVar1) {
    util::Result<wallet::SelectionResult>::operator->((Result<wallet::SelectionResult> *)in_RDX);
    SelectionResult::GetInputSet((SelectionResult *)in_RDX);
    sVar2 = std::
            set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
            ::size((set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                    *)in_RDX);
    lVar3 = sVar2 * 0x44 + 0x2c;
    do {
      this = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffda8,
                 (pointer)in_stack_fffffffffffffda0,(unsigned_long)in_RDX);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_RDX);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)this,in_stack_fffffffffffffdd0,(size_t)in_stack_fffffffffffffdc8
                 ,in_stack_fffffffffffffdc0);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<(in_stack_fffffffffffffda0,(char (*) [1])in_RDX);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffda8,
                 (pointer)in_stack_fffffffffffffda0,(unsigned_long)in_RDX);
      local_120 = lVar3 << 2;
      in_stack_fffffffffffffda8 = "MAX_STANDARD_TX_WEIGHT";
      in_stack_fffffffffffffda0 = (lazy_ostream *)&MAX_STANDARD_TX_WEIGHT;
      in_RDX = "signedTxSize * WITNESS_SCALE_FACTOR";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::le_impl,unsigned_long,int>
                (local_108,local_118,0x57e,1,5,&local_120);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_RDX);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      file = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffda8,
                 (pointer)in_stack_fffffffffffffda0,(unsigned_long)in_RDX);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_RDX);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)this,file,(size_t)in_stack_fffffffffffffdc8,
                 in_stack_fffffffffffffdc0);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<(in_stack_fffffffffffffda0,(char (*) [1])in_RDX);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffda8,
                 (pointer)in_stack_fffffffffffffda0,(unsigned_long)in_RDX);
      in_stack_fffffffffffffdc8 =
           util::Result<wallet::SelectionResult>::operator->
                     ((Result<wallet::SelectionResult> *)in_RDX);
      in_stack_fffffffffffffdc0 =
           (const_string *)
           SelectionResult::GetSelectedValue
                     ((SelectionResult *)
                      CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
      in_stack_fffffffffffffda8 = "target";
      in_RDX = "result->GetSelectedValue()";
      in_stack_fffffffffffffda0 = in_RSI;
      local_178 = in_stack_fffffffffffffdc0;
      boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::ge_impl,long,long>
                (local_160,local_170,0x580,1,7,&local_178);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_RDX);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_RDX);
  CoinsResult::~CoinsResult((CoinsResult *)in_RDX);
  std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::~unique_ptr
            ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
             in_stack_fffffffffffffda8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static util::Result<SelectionResult> select_coins(const CAmount& target, const CoinSelectionParams& cs_params, const CCoinControl& cc, std::function<CoinsResult(CWallet&)> coin_setup, const node::NodeContext& m_node)
{
    std::unique_ptr<CWallet> wallet = NewWallet(m_node);
    auto available_coins = coin_setup(*wallet);

    LOCK(wallet->cs_wallet);
    auto result = SelectCoins(*wallet, available_coins, /*pre_set_inputs=*/ {}, target, cc, cs_params);
    if (result) {
        const auto signedTxSize = 10 + 34 + 68 * result->GetInputSet().size(); // static header size + output size + inputs size (P2WPKH)
        BOOST_CHECK_LE(signedTxSize * WITNESS_SCALE_FACTOR, MAX_STANDARD_TX_WEIGHT);

        BOOST_CHECK_GE(result->GetSelectedValue(), target);
    }
    return result;
}